

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O0

void __thiscall
TPZCheckMesh::BuildDependList(TPZCheckMesh *this,int connect,TPZStack<int,_10> *dependlist)

{
  TPZAdmChunkVector<TPZConnect,_10> *this_00;
  int64_t iVar1;
  TPZConnect *this_01;
  TPZDepend *pTVar2;
  int64_t in_RDX;
  int in_ESI;
  TPZStack<int,_10> *in_RDI;
  TPZDepend *dep;
  int ic;
  int nconnects;
  int in_stack_ffffffffffffffcc;
  int local_20;
  undefined4 in_stack_fffffffffffffff0;
  
  this_00 = TPZCompMesh::ConnectVec
                      ((TPZCompMesh *)
                       (in_RDI->super_TPZManVector<int,_10>).super_TPZVec<int>._vptr_TPZVec);
  iVar1 = TPZChunkVector<TPZConnect,_10>::NElements(&this_00->super_TPZChunkVector<TPZConnect,_10>);
  for (local_20 = 0; local_20 < (int)iVar1; local_20 = local_20 + 1) {
    TPZCompMesh::ConnectVec
              ((TPZCompMesh *)(in_RDI->super_TPZManVector<int,_10>).super_TPZVec<int>._vptr_TPZVec);
    this_01 = TPZChunkVector<TPZConnect,_10>::operator[]
                        ((TPZChunkVector<TPZConnect,_10> *)
                         CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
    pTVar2 = TPZConnect::FirstDepend(this_01);
    if ((pTVar2 != (TPZDepend *)0x0) &&
       (pTVar2 = TPZConnect::TPZDepend::HasDepend(pTVar2,(long)in_ESI), pTVar2 != (TPZDepend *)0x0))
    {
      TPZStack<int,_10>::Push(in_RDI,in_stack_ffffffffffffffcc);
    }
  }
  return;
}

Assistant:

void TPZCheckMesh::BuildDependList(int connect, TPZStack<int> &dependlist) {
	int nconnects = fMesh->ConnectVec().NElements();
	int ic;
	for(ic=0; ic<nconnects; ic++) {
		TPZConnect::TPZDepend *dep = fMesh->ConnectVec()[ic].FirstDepend();
		if(dep && dep->HasDepend(connect)) {
			dependlist.Push(ic);
			continue;
		}
	}
}